

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<capnproto_test::capnp::test::TestCallOrder::Server_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1329:13)>
::destroy(SimpleTransformPromiseNode<kj::Maybe<capnproto_test::capnp::test::TestCallOrder::Server_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1329:13)>
          *this)

{
  SimpleTransformPromiseNode<kj::Maybe<capnproto_test::capnp::test::TestCallOrder::Server_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1329:13)>
  *this_local;
  
  freePromise<kj::_::SimpleTransformPromiseNode<kj::Maybe<capnproto_test::capnp::test::TestCallOrder::Server&>,capnp::_::(anonymous_namespace)::TestCase1309::run()::__0>>
            (this);
  return;
}

Assistant:

void destroy() override {
    freePromise(this);
  }